

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

int mpz_set_str(__mpz_struct *r,char *sp,int base)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uchar *sp_00;
  mp_limb_t *pmVar6;
  mp_size_t mVar7;
  byte bVar8;
  int iVar9;
  byte *__s;
  ulong uVar10;
  size_t sn;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  mpn_base_info info;
  
  pcVar13 = sp + -1;
  do {
    pcVar12 = pcVar13;
    bVar1 = pcVar12[1];
    pcVar13 = pcVar12 + 1;
    iVar3 = isspace((uint)bVar1);
  } while (iVar3 != 0);
  uVar10 = (ulong)(bVar1 == 0x2d);
  __s = (byte *)(pcVar13 + uVar10);
  iVar3 = -1;
  uVar4 = 10;
  if (base == 0) {
    bVar8 = pcVar13[uVar10];
    base = uVar4;
    if (bVar8 != 0x30) goto LAB_0049ff31;
    cVar2 = pcVar12[uVar10 + 2];
    if (cVar2 == 'B') {
LAB_004a00c9:
      base = 2;
LAB_004a00d3:
      __s = (byte *)(pcVar13 + uVar10 + 2);
      goto LAB_0049ff2f;
    }
    if (cVar2 == 'X') {
LAB_004a0035:
      base = 0x10;
      goto LAB_004a00d3;
    }
    if (cVar2 == 'b') goto LAB_004a00c9;
    if (cVar2 == 'x') goto LAB_004a0035;
    base = 8;
  }
  else {
LAB_0049ff2f:
    bVar8 = *__s;
LAB_0049ff31:
    if (bVar8 == 0) {
      iVar9 = 0;
      goto LAB_004a011d;
    }
  }
  sVar5 = strlen((char *)__s);
  sp_00 = (uchar *)(*gmp_allocate_func)(sVar5);
  if (0x24 < base) {
    uVar4 = 0x24;
  }
  sn = 0;
  while( true ) {
    bVar8 = *__s;
    if (bVar8 == 0) break;
    iVar3 = isspace((uint)bVar8);
    if (iVar3 == 0) {
      if ((byte)(bVar8 - 0x30) < 10) {
        uVar11 = (uint)(byte)(bVar8 - 0x30);
      }
      else {
        uVar11 = bVar8 - 0x61;
        if ((byte)uVar11 < 0x1a) {
          uVar11 = (uVar11 & 0xff) + uVar4;
        }
        else {
          if (0x19 < (byte)(bVar8 + 0xbf)) goto LAB_004a0044;
          uVar11 = bVar8 - 0x37;
        }
      }
      if ((uint)base <= uVar11) goto LAB_004a0044;
      sp_00[sn] = (uchar)uVar11;
      sn = sn + 1;
    }
    __s = __s + 1;
  }
  if (sn == 0) {
LAB_004a0044:
    (*gmp_free_func)(sp_00,sVar5);
    iVar9 = 0;
    iVar3 = -1;
  }
  else {
    uVar4 = mpn_base_power_of_two_p(base);
    if (uVar4 == 0) {
      mpn_get_base_info(&info,(long)base);
      uVar10 = ((info.exp + sn) - 1) / (ulong)info.exp;
      if ((long)r->_mp_alloc < (long)uVar10) {
        pmVar6 = mpz_realloc(r,uVar10);
      }
      else {
        pmVar6 = r->_mp_d;
      }
      mVar7 = mpn_set_str_other(pmVar6,sp_00,sn,(long)base,&info);
      iVar3 = (int)mVar7 - (uint)(pmVar6[mVar7 + -1] == 0);
    }
    else {
      uVar10 = uVar4 * sn + 0x3f >> 6;
      if ((long)r->_mp_alloc < (long)uVar10) {
        pmVar6 = mpz_realloc(r,uVar10);
      }
      else {
        pmVar6 = r->_mp_d;
      }
      mVar7 = mpn_set_str_bits(pmVar6,sp_00,sn,uVar4);
      iVar3 = (int)mVar7;
    }
    (*gmp_free_func)(sp_00,sVar5);
    iVar9 = -iVar3;
    if (bVar1 != 0x2d) {
      iVar9 = iVar3;
    }
    iVar3 = 0;
  }
LAB_004a011d:
  r->_mp_size = iVar9;
  return iVar3;
}

Assistant:

int
mpz_set_str (mpz_t r, const char *sp, int base)
{
  unsigned bits, value_of_a;
  mp_size_t rn, alloc;
  mp_ptr rp;
  size_t dn, sn;
  int sign;
  unsigned char *dp;

  assert (base == 0 || (base >= 2 && base <= 62));

  while (isspace( (unsigned char) *sp))
    sp++;

  sign = (*sp == '-');
  sp += sign;

  if (base == 0)
    {
      if (sp[0] == '0')
	{
	  if (sp[1] == 'x' || sp[1] == 'X')
	    {
	      base = 16;
	      sp += 2;
	    }
	  else if (sp[1] == 'b' || sp[1] == 'B')
	    {
	      base = 2;
	      sp += 2;
	    }
	  else
	    base = 8;
	}
      else
	base = 10;
    }

  if (!*sp)
    {
      r->_mp_size = 0;
      return -1;
    }
  sn = strlen(sp);
  dp = (unsigned char *) gmp_alloc (sn);

  value_of_a = (base > 36) ? 36 : 10;
  for (dn = 0; *sp; sp++)
    {
      unsigned digit;

      if (isspace ((unsigned char) *sp))
	continue;
      else if (*sp >= '0' && *sp <= '9')
	digit = *sp - '0';
      else if (*sp >= 'a' && *sp <= 'z')
	digit = *sp - 'a' + value_of_a;
      else if (*sp >= 'A' && *sp <= 'Z')
	digit = *sp - 'A' + 10;
      else
	digit = base; /* fail */

      if (digit >= (unsigned) base)
	{
	  gmp_free (dp, sn);
	  r->_mp_size = 0;
	  return -1;
	}

      dp[dn++] = digit;
    }

  if (!dn)
    {
      gmp_free (dp, sn);
      r->_mp_size = 0;
      return -1;
    }
  bits = mpn_base_power_of_two_p (base);

  if (bits > 0)
    {
      alloc = (dn * bits + GMP_LIMB_BITS - 1) / GMP_LIMB_BITS;
      rp = MPZ_REALLOC (r, alloc);
      rn = mpn_set_str_bits (rp, dp, dn, bits);
    }
  else
    {
      struct mpn_base_info info;
      mpn_get_base_info (&info, base);
      alloc = (dn + info.exp - 1) / info.exp;
      rp = MPZ_REALLOC (r, alloc);
      rn = mpn_set_str_other (rp, dp, dn, base, &info);
      /* Normalization, needed for all-zero input. */
      assert (rn > 0);
      rn -= rp[rn-1] == 0;
    }
  assert (rn <= alloc);
  gmp_free (dp, sn);

  r->_mp_size = sign ? - rn : rn;

  return 0;
}